

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcRefs.c
# Opt level: O1

void Abc_NodeMffcConeSupp_rec(Abc_Obj_t *pNode,Vec_Ptr_t *vCone,Vec_Ptr_t *vSupp,int fTopmost)

{
  int iVar1;
  Abc_Ntk_t *pAVar2;
  Abc_Ntk_t *pAVar3;
  uint uVar4;
  void **ppvVar5;
  int Fill;
  long lVar6;
  int iVar7;
  
  pAVar2 = pNode->pNtk;
  iVar7 = pNode->Id;
  Vec_IntFillExtra(&pAVar2->vTravIds,iVar7 + 1,(int)vSupp);
  if (((long)iVar7 < 0) || ((pAVar2->vTravIds).nSize <= iVar7)) {
    __assert_fail("i >= 0 && i < p->nSize",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/vec/vecInt.h"
                  ,0x19e,"int Vec_IntEntry(Vec_Int_t *, int)");
  }
  pAVar3 = pNode->pNtk;
  iVar1 = pAVar3->nTravIds;
  if ((pAVar2->vTravIds).pArray[iVar7] == iVar1) {
    return;
  }
  iVar7 = pNode->Id;
  Vec_IntFillExtra(&pAVar3->vTravIds,iVar7 + 1,Fill);
  if (((long)iVar7 < 0) || ((pAVar3->vTravIds).nSize <= iVar7)) {
    __assert_fail("i >= 0 && i < p->nSize",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/vec/vecInt.h"
                  ,0x1c0,"void Vec_IntWriteEntry(Vec_Int_t *, int, int)");
  }
  (pAVar3->vTravIds).pArray[iVar7] = iVar1;
  if ((fTopmost == 0) &&
     (((uVar4 = *(uint *)&pNode->field_0x14 & 0xf, uVar4 == 2 || (uVar4 == 5)) ||
      (0 < (pNode->vFanouts).nSize)))) {
    if (vSupp == (Vec_Ptr_t *)0x0) {
      return;
    }
    uVar4 = vSupp->nCap;
    if (vSupp->nSize == uVar4) {
      if ((int)uVar4 < 0x10) {
        if (vSupp->pArray == (void **)0x0) {
          ppvVar5 = (void **)malloc(0x80);
        }
        else {
          ppvVar5 = (void **)realloc(vSupp->pArray,0x80);
        }
        vSupp->pArray = ppvVar5;
        iVar7 = 0x10;
      }
      else {
        iVar7 = uVar4 * 2;
        if (iVar7 <= (int)uVar4) goto LAB_001f3f0d;
        if (vSupp->pArray == (void **)0x0) {
          ppvVar5 = (void **)malloc((ulong)uVar4 << 4);
        }
        else {
          ppvVar5 = (void **)realloc(vSupp->pArray,(ulong)uVar4 << 4);
        }
        vSupp->pArray = ppvVar5;
      }
      vSupp->nCap = iVar7;
    }
  }
  else {
    if (0 < (pNode->vFanins).nSize) {
      lVar6 = 0;
      do {
        Abc_NodeMffcConeSupp_rec
                  ((Abc_Obj_t *)pNode->pNtk->vObjs->pArray[(pNode->vFanins).pArray[lVar6]],vCone,
                   vSupp,0);
        lVar6 = lVar6 + 1;
      } while (lVar6 < (pNode->vFanins).nSize);
    }
    if (vCone == (Vec_Ptr_t *)0x0) {
      return;
    }
    uVar4 = vCone->nCap;
    vSupp = vCone;
    if (vCone->nSize == uVar4) {
      if ((int)uVar4 < 0x10) {
        if (vCone->pArray == (void **)0x0) {
          ppvVar5 = (void **)malloc(0x80);
        }
        else {
          ppvVar5 = (void **)realloc(vCone->pArray,0x80);
        }
        vCone->pArray = ppvVar5;
        iVar7 = 0x10;
      }
      else {
        iVar7 = uVar4 * 2;
        if (iVar7 <= (int)uVar4) goto LAB_001f3f0d;
        if (vCone->pArray == (void **)0x0) {
          ppvVar5 = (void **)malloc((ulong)uVar4 << 4);
        }
        else {
          ppvVar5 = (void **)realloc(vCone->pArray,(ulong)uVar4 << 4);
        }
        vCone->pArray = ppvVar5;
      }
      vCone->nCap = iVar7;
    }
  }
LAB_001f3f0d:
  iVar7 = vSupp->nSize;
  vSupp->nSize = iVar7 + 1;
  vSupp->pArray[iVar7] = pNode;
  return;
}

Assistant:

void Abc_NodeMffcConeSupp_rec( Abc_Obj_t * pNode, Vec_Ptr_t * vCone, Vec_Ptr_t * vSupp, int fTopmost )
{
    Abc_Obj_t * pFanin;
    int i;
    // skip visited nodes
    if ( Abc_NodeIsTravIdCurrent(pNode) )
        return;
    Abc_NodeSetTravIdCurrent(pNode);
    // add to the new support nodes
    if ( !fTopmost && (Abc_ObjIsCi(pNode) || pNode->vFanouts.nSize > 0) )
    {
        if ( vSupp ) Vec_PtrPush( vSupp, pNode );
        return;
    }
    // recur on the children
    Abc_ObjForEachFanin( pNode, pFanin, i )
        Abc_NodeMffcConeSupp_rec( pFanin, vCone, vSupp, 0 );
    // collect the internal node
    if ( vCone ) Vec_PtrPush( vCone, pNode );
//    printf( "%d ", pNode->Id );
}